

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cc
# Opt level: O3

void __thiscall raptor::TcpServer::OnConnectionClosed(TcpServer *this,ConnectionId cid)

{
  Node *node;
  
  node = (Node *)operator_new(0x58);
  (node->next)._value._M_b._M_p = (__pointer_type)0x0;
  Slice::Slice((Slice *)(node + 3));
  Slice::Slice((Slice *)(node + 7));
  node[2].next._value._M_b._M_p = (__pointer_type)cid;
  *(undefined4 *)&node[1].next._value._M_b._M_p = 2;
  MultiProducerSingleConsumerQueue::push(&this->_mpscq,node);
  LOCK();
  (this->_count)._value.super___atomic_base<unsigned_int>._M_i =
       (this->_count)._value.super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  pthread_cond_signal((pthread_cond_t *)&this->_cv);
  return;
}

Assistant:

void TcpServer::OnConnectionClosed(ConnectionId cid) {
    TcpMessageNode* msg = new TcpMessageNode;
    msg->cid = cid;
    msg->type = MessageType::kCloseClient;
    _mpscq.push(&msg->node);
    _count.FetchAdd(1, MemoryOrder::ACQ_REL);
    _cv.Signal();
}